

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp-perf.hpp
# Opt level: O3

void perf::stop(void)

{
  stack<perf::timer,_std::deque<perf::timer,_std::allocator<perf::timer>_>_> *psVar1;
  rep rVar2;
  _Elt_pointer ptVar3;
  char local_9;
  
  psVar1 = timer_stack();
  ptVar3 = (psVar1->c).super__Deque_base<perf::timer,_std::allocator<perf::timer>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (ptVar3 == (psVar1->c).super__Deque_base<perf::timer,_std::allocator<perf::timer>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    ptVar3 = (psVar1->c).super__Deque_base<perf::timer,_std::allocator<perf::timer>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
  }
  rVar2 = std::chrono::_V2::system_clock::now();
  ptVar3[-1].m_stop.__d.__r = rVar2;
  psVar1 = timer_stack();
  ptVar3 = (psVar1->c).super__Deque_base<perf::timer,_std::allocator<perf::timer>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (ptVar3 == (psVar1->c).super__Deque_base<perf::timer,_std::allocator<perf::timer>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    ptVar3 = (psVar1->c).super__Deque_base<perf::timer,_std::allocator<perf::timer>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
  }
  operator<<((ostream *)&std::cout,ptVar3 + -1);
  local_9 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_9,1);
  psVar1 = timer_stack();
  std::deque<perf::timer,_std::allocator<perf::timer>_>::pop_back(&psVar1->c);
  return;
}

Assistant:

void stop()
    {
        timer_stack().top().stop();
        *inline_out_ptr() << timer_stack().top() << '\n';
        timer_stack().pop();
    }